

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyPureVector.cpp
# Opt level: O1

void __thiscall PolicyPureVector::SetIndex(PolicyPureVector *this,LIndex i)

{
  pointer puVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  Index IVar5;
  long *plVar6;
  ulong uVar7;
  pointer puVar8;
  pointer puVar9;
  LIndex *pLVar10;
  long lVar11;
  ulong uVar12;
  LIndex *pLVar13;
  undefined1 auVar14 [64];
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> nrElems;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> local_78;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> local_58;
  PolicyPureVector *local_40;
  ulong local_38;
  undefined1 extraout_var [56];
  
  lVar11 = *(long *)&this->field_0x18;
  if (lVar11 == 0) {
    lVar11 = *(long *)&this->field_0x20;
  }
  plVar6 = (long *)__dynamic_cast(lVar11,&Interface_ProblemToPolicyDiscrete::typeinfo,
                                  &Interface_ProblemToPolicyDiscretePure::typeinfo,0);
  uVar3 = (**(code **)(*plVar6 + 0x28))
                    (plVar6,this->_m_agentI,*(undefined4 *)&this->field_0x30,
                     *(undefined8 *)&this->field_0x8);
  lVar11 = *(long *)&this->field_0x18;
  if (lVar11 == 0) {
    lVar11 = *(long *)&this->field_0x20;
  }
  plVar6 = (long *)__dynamic_cast(lVar11,&Interface_ProblemToPolicyDiscrete::typeinfo,
                                  &Interface_ProblemToPolicyDiscretePure::typeinfo,0);
  iVar4 = (**(code **)(*plVar6 + 0x20))(plVar6,this->_m_agentI);
  local_78.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x10);
  local_78.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_78.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
       super__Vector_impl_data._M_start + 2;
  *local_78.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  local_78.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 0;
  local_78.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_78.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  auVar14._0_8_ = pow((double)iVar4,(double)(int)uVar3);
  auVar14._8_56_ = extraout_var;
  uVar7 = vcvttsd2usi_avx512f(auVar14._0_16_);
  *local_78.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
   super__Vector_impl_data._M_start = uVar7;
  local_78.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = (long)iVar4;
  puVar8 = (pointer)operator_new(0x10);
  puVar9 = puVar8 + 2;
  *puVar8 = 0;
  puVar8[1] = 0;
  if (0 < (int)uVar3) {
    local_38 = (ulong)(uVar3 & 0x7fffffff);
    pLVar10 = puVar9;
    pLVar13 = puVar8;
    uVar7 = local_38;
    local_40 = this;
    do {
      uVar12 = uVar7 - 1;
      *local_78.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
       super__Vector_impl_data._M_start =
           *local_78.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
            _M_impl.super__Vector_impl_data._M_start / local_38;
      IndexTools::JointToIndividualIndices(&local_58,i,&local_78);
      puVar9 = local_58.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      puVar8 = local_58.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_58.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
      super__Vector_impl_data._M_start = (LIndex *)0x0;
      local_58.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (LIndex *)0x0;
      operator_delete(pLVar13,(long)pLVar10 - (long)pLVar13);
      if (local_58.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
          _M_impl.super__Vector_impl_data._M_start != (LIndex *)0x0) {
        operator_delete(local_58.
                        super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_58.
                              super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.
                              super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      IVar5 = Globals::CastLIndexToIndex(puVar8[1]);
      puVar1 = (local_40->_m_domainToActionIndices).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(local_40->_m_domainToActionIndices).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar1 >> 2) <= uVar12) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar12);
      }
      puVar1[uVar12] = IVar5;
      i = *puVar8;
      bVar2 = 1 < (long)uVar7;
      pLVar10 = puVar9;
      pLVar13 = puVar8;
      uVar7 = uVar12;
    } while (bVar2);
  }
  operator_delete(puVar8,(long)puVar9 - (long)puVar8);
  if (local_78.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (ulong *)0x0) {
    operator_delete(local_78.
                    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PolicyPureVector::SetIndex(LIndex i)
{
    int nrO=GetInterfacePTPDiscretePure()->
        GetNrPolicyDomainElements(_m_agentI, 
                                  GetPolicyDomainCategory(),
                                  GetDepth()),
        nrA=GetInterfacePTPDiscretePure()->GetNrActions(_m_agentI);
    
    vector<LIndex> nrElems(2);
    nrElems[0]=static_cast<LIndex>(pow(static_cast<double>(nrA),nrO));
    nrElems[1]=nrA;
    vector<LIndex> indexVec(2);

    for(int o=nrO-1;o>=0;--o)
    {
        nrElems[0]/=nrO;
        indexVec=IndexTools::JointToIndividualIndices(i,nrElems);
        SetAction(o,CastLIndexToIndex(indexVec[1]));
        i=indexVec[0];
    }
}